

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * tinyusdz::print_typed_terminal_attr<float>
                   (string *__return_storage_ptr__,TypedTerminalAttribute<float> *attr,string *name,
                   uint32_t indent)

{
  bool bVar1;
  ostream *poVar2;
  uint32_t indent_00;
  uint32_t n;
  uint32_t n_00;
  stringstream ss;
  string sStack_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  indent_00 = indent;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  if (attr->_authored == true) {
    pprint::Indent_abi_cxx11_(&sStack_1f8,(pprint *)(ulong)indent,n);
    ::std::operator<<(local_1a8,(string *)&sStack_1f8);
    ::std::__cxx11::string::_M_dispose();
    if ((attr->_actual_type_name)._M_string_length == 0) {
      value::TypeTraits<float>::type_name_abi_cxx11_();
      poVar2 = ::std::operator<<(local_1a8,(string *)&sStack_1f8);
      poVar2 = ::std::operator<<(poVar2," ");
      ::std::operator<<(poVar2,(string *)name);
      ::std::__cxx11::string::_M_dispose();
    }
    else {
      poVar2 = ::std::operator<<(local_1a8,(string *)&attr->_actual_type_name);
      poVar2 = ::std::operator<<(poVar2," ");
      ::std::operator<<(poVar2,(string *)name);
    }
    bVar1 = AttrMetas::authored(&attr->_metas);
    if (bVar1) {
      poVar2 = ::std::operator<<(local_1a8," (\n");
      print_attr_metas_abi_cxx11_
                (&sStack_1f8,(tinyusdz *)attr,(AttrMeta *)(ulong)(indent + 1),indent_00);
      poVar2 = ::std::operator<<(poVar2,(string *)&sStack_1f8);
      pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)(ulong)indent,n_00);
      poVar2 = ::std::operator<<(poVar2,(string *)&local_1d8);
      ::std::operator<<(poVar2,")");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::operator<<(local_1a8,"\n");
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string print_typed_terminal_attr(const TypedTerminalAttribute<T> &attr,
                                      const std::string &name,
                                      const uint32_t indent) {
  std::stringstream ss;

  if (attr.authored()) {
    ss << pprint::Indent(indent);

    if (attr.has_actual_type()) {
      ss << attr.get_actual_type_name() << " " << name;
    } else {
      ss << value::TypeTraits<T>::type_name() << " " << name;
    }

    if (attr.metas().authored()) {
      ss << " (\n"
         << print_attr_metas(attr.metas(), indent + 1) << pprint::Indent(indent)
         << ")";
    }
    ss << "\n";
  }

  return ss.str();
}